

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O0

void CaDiCaL::catch_signal(int sig)

{
  int in_EDI;
  double dVar1;
  
  if ((in_EDI != 0xe) || (dVar1 = absolute_real_time(), dVar1 < (double)alarm_time)) {
    if (((caught_signal & 1) == 0) && (caught_signal = 1, signal_handler != (long *)0x0)) {
      (**(code **)(*signal_handler + 0x10))(signal_handler,in_EDI);
    }
    Signal::reset();
    raise(in_EDI);
  }
  else {
    if (((caught_alarm & 1) == 0) && (caught_alarm = 1, signal_handler != (long *)0x0)) {
      (**(code **)(*signal_handler + 0x18))();
    }
    Signal::reset_alarm();
  }
  return;
}

Assistant:

static void catch_signal (int sig) {
#ifndef __WIN32
  if (sig == SIGALRM && absolute_real_time () >= alarm_time) {
    if (!caught_alarm) {
      caught_alarm = true;
      if (signal_handler)
        signal_handler->catch_alarm ();
    }
    Signal::reset_alarm ();
  } else
#endif
  {
    if (!caught_signal) {
      caught_signal = true;
      if (signal_handler)
        signal_handler->catch_signal (sig);
    }
    Signal::reset ();
    ::raise (sig);
  }
}